

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::State::SetLabel(State *this,char *label)

{
  char cVar1;
  size_type sVar2;
  MutexLock l;
  CheckHandler CStack_38;
  unique_lock<std::mutex> local_30;
  
  cVar1 = (anonymous_namespace)::running_benchmark;
  if ((anonymous_namespace)::running_benchmark == '\x01') {
    internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              (&CStack_38,"running_benchmark",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"SetLabel",0x3f4);
  }
  if (cVar1 != '\0') {
    if (GetBenchmarkLock()::lock == '\0') {
      SetLabel();
    }
    local_30._M_device = (mutex_type *)GetBenchmarkLock()::lock;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    (anonymous_namespace)::GetReportLabel_abi_cxx11_();
    sVar2 = (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_string_length;
    strlen(label);
    std::__cxx11::string::_M_replace(0x1439e0,0,(char *)sVar2,(ulong)label);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    return;
  }
  internal::CheckHandler::~CheckHandler(&CStack_38);
}

Assistant:

void State::SetLabel(const char* label) {
  CHECK(running_benchmark);
  MutexLock l(GetBenchmarkLock());
  *GetReportLabel() = label;
}